

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

bool __thiscall
testing::internal::
UnorderedElementsAreMatcherImpl<const_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>_&>
::MatchAndExplain(UnorderedElementsAreMatcherImpl<const_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>_&>
                  *this,array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                        *container,MatchResultListener *listener)

{
  bool bVar1;
  MatchResultListener *this_00;
  pointer *__ptr;
  MatchMatrix matrix;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  element_printouts;
  undefined1 local_68 [16];
  pointer local_58;
  _Vector_base<char,_std::allocator<char>_> local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  UnorderedElementsAreMatcherImpl<std::array<std::__cxx11::string,2ul>const&>::
  AnalyzeElements<std::__cxx11::string_const*>
            ((MatchMatrix *)(local_68 + 8),
             (UnorderedElementsAreMatcherImpl<std::array<std::__cxx11::string,2ul>const&> *)this,
             container->_M_elems,container[1]._M_elems,&local_38,listener);
  bVar1 = true;
  if ((pointer)local_68._8_8_ != (pointer)0x0 || local_58 != (pointer)0x0) {
    if ((pointer)local_68._8_8_ == local_58 ||
        (this->super_UnorderedElementsAreMatcherImplBase).match_flags_ != ExactMatch) {
      bVar1 = UnorderedElementsAreMatcherImplBase::VerifyMatchMatrix
                        (&this->super_UnorderedElementsAreMatcherImplBase,&local_38,
                         (MatchMatrix *)(local_68 + 8),listener);
      if (bVar1) {
        bVar1 = UnorderedElementsAreMatcherImplBase::FindPairing
                          (&this->super_UnorderedElementsAreMatcherImplBase,
                           (MatchMatrix *)(local_68 + 8),listener);
        goto LAB_0011aff7;
      }
    }
    else if (((pointer)local_68._8_8_ != (pointer)0x0) && (listener->stream_ != (ostream *)0x0)) {
      this_00 = MatchResultListener::operator<<(listener,(char (*) [11])"which has ");
      UnorderedElementsAreMatcherImplBase::Elements
                ((UnorderedElementsAreMatcherImplBase *)local_68,local_68._8_8_);
      MatchResultListener::operator<<(this_00,(Message *)local_68);
      if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )local_68._0_8_ !=
          (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )0x0) {
        (**(code **)(*(long *)local_68._0_8_ + 8))();
      }
    }
    bVar1 = false;
  }
LAB_0011aff7:
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_50);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38);
  return bVar1;
}

Assistant:

bool MatchAndExplain(Container container,
                       MatchResultListener* listener) const override {
    StlContainerReference stl_container = View::ConstReference(container);
    ::std::vector<std::string> element_printouts;
    MatchMatrix matrix =
        AnalyzeElements(stl_container.begin(), stl_container.end(),
                        &element_printouts, listener);

    if (matrix.LhsSize() == 0 && matrix.RhsSize() == 0) {
      return true;
    }

    if (match_flags() == UnorderedMatcherRequire::ExactMatch) {
      if (matrix.LhsSize() != matrix.RhsSize()) {
        // The element count doesn't match.  If the container is empty,
        // there's no need to explain anything as Google Mock already
        // prints the empty container. Otherwise we just need to show
        // how many elements there actually are.
        if (matrix.LhsSize() != 0 && listener->IsInterested()) {
          *listener << "which has " << Elements(matrix.LhsSize());
        }
        return false;
      }
    }

    return VerifyMatchMatrix(element_printouts, matrix, listener) &&
           FindPairing(matrix, listener);
  }